

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_tRNS(LodePNGColorMode *color,uchar *data,size_t chunkLength)

{
  LodePNGColorType LVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  LVar1 = color->colortype;
  if (LVar1 == LCT_GREY) {
    if (chunkLength != 2) {
      return 0x1e;
    }
    color->key_defined = 1;
    uVar2 = *(ushort *)data << 8 | *(ushort *)data >> 8;
    color->key_b = (uint)uVar2;
    color->key_g = (uint)uVar2;
    lVar4 = 0x1c;
  }
  else {
    if (LVar1 != LCT_RGB) {
      uVar3 = 0x2a;
      if ((LVar1 == LCT_PALETTE) && (uVar3 = 0x27, chunkLength <= color->palettesize)) {
        if (chunkLength == 0) {
          return 0;
        }
        uVar3 = 3;
        uVar5 = 0;
        do {
          color->palette[uVar3] = data[uVar5];
          uVar5 = uVar5 + 1;
          uVar3 = uVar3 + 4;
        } while ((uVar5 & 0xffffffff) != chunkLength);
        return 0;
      }
      return uVar3;
    }
    if (chunkLength != 6) {
      return 0x29;
    }
    color->key_defined = 1;
    color->key_r = (uint)(ushort)(*(ushort *)data << 8 | *(ushort *)data >> 8);
    color->key_g = (uint)(ushort)(*(ushort *)(data + 2) << 8 | *(ushort *)(data + 2) >> 8);
    uVar2 = *(ushort *)(data + 4) << 8 | *(ushort *)(data + 4) >> 8;
    lVar4 = 0x24;
  }
  *(uint *)((long)&color->colortype + lVar4) = (uint)uVar2;
  return 0;
}

Assistant:

static unsigned readChunk_tRNS(LodePNGColorMode* color, const unsigned char* data, size_t chunkLength)
{
  unsigned i;
  if(color->colortype == LCT_PALETTE)
  {
    /*error: more alpha values given than there are palette entries*/
    if(chunkLength > color->palettesize) return 39;

    for(i = 0; i != chunkLength; ++i) color->palette[4 * i + 3] = data[i];
  }
  else if(color->colortype == LCT_GREY)
  {
    /*error: this chunk must be 2 bytes for greyscale image*/
    if(chunkLength != 2) return 30;

    color->key_defined = 1;
    color->key_r = color->key_g = color->key_b = 256u * data[0] + data[1];
  }
  else if(color->colortype == LCT_RGB)
  {
    /*error: this chunk must be 6 bytes for RGB image*/
    if(chunkLength != 6) return 41;

    color->key_defined = 1;
    color->key_r = 256u * data[0] + data[1];
    color->key_g = 256u * data[2] + data[3];
    color->key_b = 256u * data[4] + data[5];
  }
  else return 42; /*error: tRNS chunk not allowed for other color models*/

  return 0; /* OK */
}